

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintwide_t.h
# Opt level: O1

result_type __thiscall
math::wide_integer::uniform_int_distribution<128u,unsigned_int,void,false>::
generate<std::linear_congruential_engine<unsigned_int,48271u,0u,2147483647u>,32>
          (uniform_int_distribution<128u,unsigned_int,void,false> *this,
          linear_congruential_engine<unsigned_int,_48271U,_0U,_2147483647U> *input_generator,
          param_type *input_params)

{
  uint *puVar1;
  uint *puVar2;
  int *piVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  unsigned_fast_type i;
  byte bVar6;
  sbyte sVar7;
  ulong uVar8;
  long lVar9;
  uint uVar10;
  byte bVar11;
  uint uVar12;
  uint uVar13;
  bool bVar14;
  result_type range;
  uintwide_t<128U,_unsigned_int,_void,_false> local_68;
  array<unsigned_int,_4UL> local_58;
  array<unsigned_int,_4UL> local_48;
  undefined8 local_38;
  undefined8 uStack_30;
  uint local_28 [4];
  
  local_48.elems[0] = 0;
  local_48.elems[1] = 0;
  local_48.elems[2] = 0;
  local_48.elems[3] = 0;
  uVar10 = input_generator->_M_x;
  uVar12 = 0;
  bVar11 = 1;
  lVar9 = 0;
  do {
    bVar6 = bVar11 - 1 & 3;
    if (bVar6 == 0) {
      uVar13 = (uVar10 % 0xadc8) * 0xbc8f;
      uVar12 = (uVar10 / 0xadc8) * 0xd47;
      uVar10 = (uVar10 / 0xadc8) * -0xd47;
      if (uVar13 < uVar12) {
        uVar10 = uVar12 ^ 0x7fffffff;
      }
      uVar10 = uVar10 + uVar13;
      input_generator->_M_x = uVar10;
      uVar12 = uVar10;
    }
    sVar7 = bVar6 << 3;
    puVar1 = (uint *)((long)local_48.elems + lVar9);
    *puVar1 = *puVar1 | (uVar12 >> sVar7 & 0xff) << sVar7;
    lVar9 = lVar9 + (ulong)((bVar11 & 3) == 0) * 4;
    bVar11 = bVar11 + 1;
  } while (lVar9 != 0x10);
  uVar4 = *(undefined8 *)input_params;
  uVar5 = *(undefined8 *)(input_params[1].param_a.values.super_array<unsigned_char,_3UL>.elems + 2);
  local_68.values.super_array<unsigned_int,_4UL>.elems[0] = (value_type_conflict)uVar4;
  local_68.values.super_array<unsigned_int,_4UL>.elems[1] = SUB84(uVar4,4);
  local_68.values.super_array<unsigned_int,_4UL>.elems[2] = (value_type_conflict)uVar5;
  local_68.values.super_array<unsigned_int,_4UL>.elems[3] = SUB84(uVar5,4);
  local_58.elems[0] = 0;
  local_58.elems[1] = 0;
  local_58.elems[2] = 0;
  local_58.elems[3] = 0;
  lVar9 = 0xc;
  do {
    bVar11 = 0;
    if (lVar9 == -4) break;
    uVar10 = *(uint *)((long)local_68.values.super_array<unsigned_int,_4UL>.elems + lVar9);
    uVar12 = *(uint *)((long)local_58.elems + lVar9);
    bVar11 = -(uVar10 <= uVar12) | 1;
    lVar9 = lVar9 + -4;
  } while (uVar10 == uVar12);
  if (bVar11 == 0) {
    local_38 = *(undefined8 *)
                (input_params[2].param_b.values.super_array<unsigned_char,_3UL>.elems + 1);
    uStack_30 = *(undefined8 *)(input_params + 4);
    local_28[0] = 0xffffffff;
    local_28[1] = 0xffffffff;
    local_28[2] = 0xffffffff;
    local_28[3] = 0xffffffff;
    lVar9 = 0xc;
    do {
      bVar11 = 0;
      if (lVar9 == -4) break;
      puVar1 = (uint *)((long)&local_38 + lVar9);
      puVar2 = (uint *)((long)local_28 + lVar9);
      bVar11 = -(*puVar1 <= *puVar2) | 1;
      lVar9 = lVar9 + -4;
    } while (*puVar1 == *puVar2);
    if (bVar11 == 0) goto LAB_0014ecb1;
  }
  local_38._0_4_ = (value_type_conflict)uVar4;
  local_38._4_4_ = SUB84(uVar4,4);
  uStack_30._0_4_ = (value_type_conflict)uVar5;
  uStack_30._4_4_ = SUB84(uVar5,4);
  local_68.values.super_array<unsigned_int,_4UL>.elems._0_8_ =
       *(undefined8 *)(input_params[2].param_b.values.super_array<unsigned_char,_3UL>.elems + 1);
  local_68.values.super_array<unsigned_int,_4UL>.elems._8_8_ = *(undefined8 *)(input_params + 4);
  lVar9 = 0;
  bVar14 = false;
  do {
    uVar8 = ((ulong)local_68.values.super_array<unsigned_int,_4UL>.elems[lVar9] - (ulong)bVar14) -
            (ulong)*(uint *)((long)&local_38 + lVar9 * 4);
    local_68.values.super_array<unsigned_int,_4UL>.elems[lVar9] = (value_type_conflict)uVar8;
    bVar14 = uVar8 >> 0x20 != 0;
    lVar9 = lVar9 + 1;
  } while (lVar9 != 4);
  local_58.elems[2] = local_68.values.super_array<unsigned_int,_4UL>.elems[2];
  local_58.elems[3] = local_68.values.super_array<unsigned_int,_4UL>.elems[3];
  local_58.elems[0] = local_68.values.super_array<unsigned_int,_4UL>.elems[0];
  local_58.elems[1] = local_68.values.super_array<unsigned_int,_4UL>.elems[1];
  lVar9 = 0;
  do {
    piVar3 = (int *)((long)local_58.elems + lVar9);
    *piVar3 = *piVar3 + 1;
    if (*piVar3 != 0) break;
    bVar14 = lVar9 != 0xc;
    lVar9 = lVar9 + 4;
  } while (bVar14);
  local_68.values.super_array<unsigned_int,_4UL>.elems[0] = 0;
  local_68.values.super_array<unsigned_int,_4UL>.elems[1] = 0;
  local_68.values.super_array<unsigned_int,_4UL>.elems[2] = 0;
  local_68.values.super_array<unsigned_int,_4UL>.elems[3] = 0;
  uintwide_t<128U,_unsigned_int,_void,_false>::eval_divide_knuth
            ((uintwide_t<128U,_unsigned_int,_void,_false> *)&local_48,
             (uintwide_t<128U,_unsigned_int,_void,_false> *)&local_58,&local_68);
  local_48.elems[2] = local_68.values.super_array<unsigned_int,_4UL>.elems[2];
  local_48.elems[3] = local_68.values.super_array<unsigned_int,_4UL>.elems[3];
  local_48.elems[0] = local_68.values.super_array<unsigned_int,_4UL>.elems[0];
  local_48.elems[1] = local_68.values.super_array<unsigned_int,_4UL>.elems[1];
  local_68.values.super_array<unsigned_int,_4UL>.elems._0_8_ = *(undefined8 *)input_params;
  local_68.values.super_array<unsigned_int,_4UL>.elems._8_8_ =
       *(undefined8 *)(input_params[1].param_a.values.super_array<unsigned_char,_3UL>.elems + 2);
  uintwide_t<128U,_unsigned_int,_void,_false>::operator+=
            ((uintwide_t<128U,_unsigned_int,_void,_false> *)&local_48,&local_68);
LAB_0014ecb1:
  return (result_type)local_48.elems[0]._0_3_;
}

Assistant:

constexpr auto generate(GeneratorType& input_generator,
                            const param_type& input_params) const -> result_type
    {
      // Generate random numbers r, where a <= r <= b.

      auto result = static_cast<result_type>(static_cast<std::uint8_t>(UINT8_C(0)));

      using local_limb_type = typename result_type::limb_type;

      using generator_result_type = typename GeneratorType::result_type;

      constexpr auto digits_generator_result_type = static_cast<std::uint32_t>(GeneratorResultBits);

      static_assert(static_cast<std::uint32_t>(digits_generator_result_type % static_cast<std::uint32_t>(UINT8_C(8))) == static_cast<std::uint32_t>(UINT8_C(0)),
                    "Error: Generator result type must have a multiple of 8 bits.");

      constexpr auto digits_limb_ratio =
        static_cast<std::uint32_t>(std::numeric_limits<local_limb_type>::digits / static_cast<int>(INT8_C(8)));

      constexpr auto digits_gtor_ratio = static_cast<std::uint32_t>(digits_generator_result_type / static_cast<std::uint32_t>(UINT8_C(8)));

      generator_result_type value = generator_result_type();

      auto it = result.representation().begin(); // NOLINT(llvm-qualified-auto,readability-qualified-auto,altera-id-dependent-backward-branch)

      auto j = static_cast<unsigned_fast_type>(UINT8_C(0));

      while(it != result.representation().end()) // NOLINT(altera-id-dependent-backward-branch)
      {
        if(static_cast<unsigned_fast_type>(j % static_cast<unsigned_fast_type>(digits_gtor_ratio)) == static_cast<unsigned_fast_type>(UINT8_C(0)))
        {
          value = input_generator();
        }

        const auto right_shift_amount =
          static_cast<unsigned>
          (
              static_cast<unsigned_fast_type>(j % digits_gtor_ratio)
            * static_cast<unsigned_fast_type>(UINT8_C(8))
          );

        const auto next_byte = static_cast<std::uint8_t>(value >> right_shift_amount);

        *it =
          static_cast<typename result_type::limb_type>
          (
            *it | static_cast<local_limb_type>(static_cast<local_limb_type>(next_byte) << static_cast<unsigned>(static_cast<unsigned_fast_type>(j % digits_limb_ratio) * static_cast<unsigned_fast_type>(UINT8_C(8))))
          );

        ++j;

        if(static_cast<unsigned_fast_type>(j % digits_limb_ratio) == static_cast<unsigned_fast_type>(UINT8_C(0)))
        {
          ++it;
        }
      }

      if(   (input_params.get_a() != (std::numeric_limits<result_type>::min)())
         || (input_params.get_b() != (std::numeric_limits<result_type>::max)()))
      {
        // Note that this restricts the range r to:
        //   r = { [input_generator() % ((b - a) + 1)] + a }

        result_type range(input_params.get_b() - input_params.get_a());

        ++range;

        result %= range;
        result += input_params.get_a();
      }

      return result;
    }